

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O0

void __thiscall FIX::Initiator::~Initiator(Initiator *this)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::Session_*>_> local_18;
  iterator i;
  Initiator *this_local;
  
  this->_vptr_Initiator = (_func_int **)&PTR__Initiator_0030c258;
  i._M_node = (_Base_ptr)this;
  std::_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>::_Rb_tree_iterator
            (&local_18);
  local_20 = (_Base_ptr)
             std::
             map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
             ::begin(&this->m_sessions);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
         ::end(&this->m_sessions);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>::operator->
                       (&local_18);
    if (ppVar2->second != (Session *)0x0) {
      (*ppVar2->second->_vptr_Session[1])();
    }
    std::_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>::operator++(&local_18);
  }
  if ((this->m_pLogFactory != (LogFactory *)0x0) && (this->m_pLog != (Log *)0x0)) {
    (**(code **)(*(long *)this->m_pLogFactory + 0x20))(this->m_pLogFactory,this->m_pLog);
  }
  Mutex::~Mutex(&this->m_mutex);
  NullLog::~NullLog(&this->m_nullLog);
  SessionSettings::~SessionSettings(&this->m_settings);
  std::
  map<FIX::SessionID,_int,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_int>_>_>
  ::~map(&this->m_sessionState);
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::~set
            (&this->m_disconnected);
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::~set
            (&this->m_connected);
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::~set
            (&this->m_pending);
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::~set
            (&this->m_sessionIDs);
  std::
  map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
  ::~map(&this->m_sessions);
  return;
}

Assistant:

Initiator::~Initiator()
{
  Sessions::iterator i;
  for ( i = m_sessions.begin(); i != m_sessions.end(); ++i )
    delete i->second;

  if( m_pLogFactory && m_pLog )
    m_pLogFactory->destroy( m_pLog );
}